

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall ON_DimStyle::SetZeroSuppress(ON_DimStyle *this,suppress_zero s)

{
  undefined8 uVar1;
  bool bVar2;
  
  if (this->m_zero_suppress != s) {
    bVar2 = ZeroSuppressMatchesLengthDisplay(s,this->m_dimension_length_display);
    if (bVar2) {
      this->m_zero_suppress = s;
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_
      ;
      *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
    }
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,ZeroSuppress);
  return;
}

Assistant:

void ON_DimStyle::SetZeroSuppress(ON_DimStyle::suppress_zero s)
{
  if (m_zero_suppress != s)
  {
    if (ON_DimStyle::ZeroSuppressMatchesLengthDisplay(s, DimensionLengthDisplay()))
    {
      m_zero_suppress = s;
      Internal_ContentChange();
    }
    //else
    //{
    //  ON_ERROR("Attempting to set zero suppression to a value that doesn't match length display.");
    //}
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::ZeroSuppress);
}